

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O1

char duckdb::SubtractOperatorOverflowCheck::Operation<signed_char,signed_char,signed_char>
               (char left,char right)

{
  char cVar1;
  int iVar2;
  OutOfRangeException *this;
  PhysicalType type;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000039,left) - (int)CONCAT71(in_register_00000031,right);
  cVar1 = (char)iVar2;
  if ((short)cVar1 == (short)iVar2) {
    return cVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Overflow in subtraction of %s (%s - %s)!","");
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0x3,type);
  NumericHelper::ToString<signed_char>(&local_60,left);
  NumericHelper::ToString<signed_char>(&local_80,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a0,&local_40,&local_60,&local_80);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		return left - right;
	}